

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O3

int LS_ThrustThing(line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,int arg4)

{
  int iVar1;
  AActor *it_00;
  
  if (arg3 == 0) {
    iVar1 = 0;
    if ((it != (AActor *)0x0) && (iVar1 = 0, (level.flags2._2_1_ >> 7 & backSide) == 0)) {
      ThrustThingHelper(it,(DAngle)((double)arg0 * 1.40625),(double)arg1,arg2);
      iVar1 = 1;
    }
  }
  else {
    it_00 = AActor::TIDHash[arg3 & 0x7f];
    iVar1 = 1;
    if (it_00 != (AActor *)0x0) {
      do {
        if (it_00->tid == arg3) {
          ThrustThingHelper(it_00,(DAngle)((double)arg0 * 1.40625),(double)arg1,arg2);
        }
        it_00 = it_00->inext;
      } while (it_00 != (AActor *)0x0);
    }
  }
  return iVar1;
}

Assistant:

FUNC(LS_ThrustThing)
// ThrustThing (angle, force, nolimit, tid)
{
	if (arg3 != 0)
	{
		FActorIterator iterator (arg3);
		while ((it = iterator.Next()) != NULL)
		{
			ThrustThingHelper (it, BYTEANGLE(arg0), arg1, arg2);
		}
		return true;
	}
	else if (it)
	{
		if (level.flags2 & LEVEL2_HEXENHACK && backSide)
		{
			return false;
		}
		ThrustThingHelper (it, BYTEANGLE(arg0), arg1, arg2);
		return true;
	}
	return false;
}